

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void c4::detail::base64_test_tables(void)

{
  size_t i;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (lVar1 != (char)(&base64_char_to_sextet_)[(char)(&base64_sextet_to_char_)[lVar1]]) {
      base64_test_tables();
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  lVar1 = 0;
  do {
    if (((long)(char)(&base64_char_to_sextet_)[lVar1] != -1) &&
       (lVar1 != (char)(&base64_sextet_to_char_)[(char)(&base64_char_to_sextet_)[lVar1]])) {
      base64_test_tables();
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x80);
  return;
}

Assistant:

void base64_test_tables()
{
    for(size_t i = 0; i < C4_COUNTOF(detail::base64_sextet_to_char_); ++i)
    {
        char s2c = base64_sextet_to_char_[i];
        char c2s = base64_char_to_sextet_[(int)s2c];
        C4_CHECK((size_t)c2s == i);
    }
    for(size_t i = 0; i < C4_COUNTOF(detail::base64_char_to_sextet_); ++i)
    {
        char c2s = base64_char_to_sextet_[i];
        if(c2s == char(-1))
            continue;
        char s2c = base64_sextet_to_char_[(int)c2s];
        C4_CHECK((size_t)s2c == i);
    }
}